

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O0

string * CreatePacketV1(string *user_data)

{
  string *in_RSI;
  undefined1 local_58 [8];
  Packet packet;
  string *user_data_local;
  string *result;
  
  packet._55_1_ = 0;
  std::__cxx11::string::string((string *)user_data);
  udpdiscovery::Packet::Packet((Packet *)local_58);
  udpdiscovery::Packet::set_packet_type((Packet *)local_58,kPacketIAmHere);
  udpdiscovery::Packet::set_application_id((Packet *)local_58,0x3039);
  udpdiscovery::Packet::set_peer_id((Packet *)local_58,0xd431);
  udpdiscovery::Packet::set_snapshot_index((Packet *)local_58,0x499602d2);
  udpdiscovery::Packet::set_user_data((Packet *)local_58,in_RSI);
  udpdiscovery::Packet::Serialize((Packet *)local_58,kProtocolVersion1,user_data);
  packet._55_1_ = 1;
  udpdiscovery::Packet::~Packet((Packet *)local_58);
  if ((packet._55_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)user_data);
  }
  return user_data;
}

Assistant:

std::string CreatePacketV1(const std::string& user_data) {
  std::string result;

  udpdiscovery::Packet packet;
  packet.set_packet_type(udpdiscovery::kPacketIAmHere);
  packet.set_application_id(kApplicationId);
  packet.set_peer_id(kPeerId);
  packet.set_snapshot_index(kSnapshotIndex);
  packet.set_user_data(user_data);

  packet.Serialize(udpdiscovery::kProtocolVersion1, result);

  return result;
}